

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

double openjtalk_getMsdThreshold(OpenJTalk *oj)

{
  undefined8 in_RAX;
  double dVar1;
  _Bool error;
  _Bool local_11;
  
  local_11 = SUB81((ulong)in_RAX >> 0x38,0);
  if (oj != (OpenJTalk *)0x0) {
    oj->errorCode = OPENJTALKERROR_NO_ERROR;
    dVar1 = Open_JTalk_get_msd_threshold(oj->open_jtalk,0,&local_11);
    if (local_11 == true) {
      oj->errorCode = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
      dVar1 = 0.0;
    }
    else {
      oj->msd_threshold = dVar1;
    }
    return dVar1;
  }
  g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
  return 0.0;
}

Assistant:

OPENJTALK_CONVENTION openjtalk_getMsdThreshold(OpenJTalk *oj)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return 0.0;
	}

	oj->errorCode = OPENJTALKERROR_NO_ERROR;
	bool error;
	double res = Open_JTalk_get_msd_threshold(oj->open_jtalk, 0, &error);
	if (error)
	{
		oj->errorCode = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return 0.0;
	}
	oj->msd_threshold = res;
	return oj->msd_threshold;
}